

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

void output_nnybble(char *outfile,int n,uchar *array)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  uint uVar5;
  ulong uVar6;
  ulong uVar4;
  
  if (n != 1) {
    uVar6 = 0;
    uVar5 = 0;
    if (bits_to_go2 < 5) {
      output_nybble(outfile,(uint)*array);
      if (n == 2) {
        array = array + 1;
        goto LAB_001b457f;
      }
      uVar5 = 1;
    }
    uVar2 = (long)(int)(n - uVar5) / 2;
    cVar1 = (char)bits_to_go2;
    if (0 < (int)uVar2) {
      uVar6 = uVar2 & 0xffffffff;
    }
    uVar2 = (ulong)uVar5;
    if (bits_to_go2 == 8) {
      buffer2 = 0;
      uVar4 = uVar6;
      while( true ) {
        iVar3 = (int)uVar4;
        uVar4 = (ulong)(iVar3 - 1);
        if (iVar3 == 0) break;
        outfile[noutchar] = array[uVar2 + 1] & 0xf | array[uVar2] << 4;
        uVar2 = uVar2 + 2;
        noutchar = noutchar + 1;
      }
    }
    else {
      uVar4 = uVar6;
      uVar5 = buffer2;
      while( true ) {
        iVar3 = (int)uVar4;
        uVar4 = (ulong)(iVar3 - 1);
        if (iVar3 == 0) break;
        uVar5 = array[uVar2 + 1] & 0xf | (uint)(byte)(array[uVar2] << 4) | uVar5 << 8;
        uVar2 = uVar2 + 2;
        buffer2 = uVar5;
        outfile[noutchar] = (char)((int)uVar5 >> (-(cVar1 + -8) & 0x1fU));
        noutchar = noutchar + 1;
      }
    }
    bitcount = bitcount + ((int)uVar6 * 8 + -8);
    if ((int)uVar2 == n) {
      return;
    }
    array = array + (long)n + -1;
  }
LAB_001b457f:
  output_nybble(outfile,(uint)*array);
  return;
}

Assistant:

static void output_nnybble(char *outfile, int n, unsigned char array[])
{
	/* pack the 4 lower bits in each element of the array into the outfile array */

int ii, jj, kk = 0, shift;

	if (n == 1) {
		output_nybble(outfile, (int) array[0]);
		return;
	}
/* forcing byte alignment doesn;t help, and even makes it go slightly slower
if (bits_to_go2 != 8)
   output_nbits(outfile, kk, bits_to_go2);
*/
	if (bits_to_go2 <= 4)
	{
		/* just room for 1 nybble; write it out separately */
		output_nybble(outfile, array[0]);
		kk++;  /* index to next array element */

		if (n == 2)  /* only 1 more nybble to write out */
		{
			output_nybble(outfile, (int) array[1]);
			return;
		}
	}


        /* bits_to_go2 is now in the range 5 - 8 */
	shift = 8 - bits_to_go2;  

	/* now write out pairs of nybbles; this does not affect value of bits_to_go2 */
	jj = (n - kk) / 2;
	
	if (bits_to_go2 == 8) {
	    /* special case if nybbles are aligned on byte boundary */
	    /* this actually seems to make very little differnece in speed */
	    buffer2 = 0;
	    for (ii = 0; ii < jj; ii++)
	    {
		outfile[noutchar] = ((array[kk] & 15)<<4) | (array[kk+1] & 15);
		kk += 2;
		noutchar++;
	    }
	} else {
	    for (ii = 0; ii < jj; ii++)
	    {
		buffer2 = (buffer2<<8) | ((array[kk] & 15)<<4) | (array[kk+1] & 15);
		kk += 2;

		/*
		 buffer2 full, put out top 8 bits
		 */

	        outfile[noutchar] = ((buffer2>>shift) & 0xff);
		noutchar++;
	    }
	}

	bitcount += (8 * (ii - 1));

	/* write out last odd nybble, if present */
	if (kk != n) output_nybble(outfile, (int) array[n - 1]); 

	return; 
}